

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,sdf_tools::real3,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<pybind11::detail::value_and_holder&,sdf_tools::real3,sdf_tools::real3,float,bool>
           *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined8 uVar1;
  handle hVar2;
  bool bVar3;
  reference rVar4;
  
  uVar1 = **(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  *(undefined8 *)(this + 0x38) = uVar1;
  hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x20),hVar2,(*rVar4._M_p & rVar4._M_mask) != 0);
  if (bVar3) {
    hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
    bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)(this + 8),hVar2,(*rVar4._M_p & rVar4._M_mask) != 0);
    if (bVar3) {
      hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
      bVar3 = type_caster<float,_void>::load
                        ((type_caster<float,_void> *)(this + 4),hVar2,
                         (*rVar4._M_p & rVar4._M_mask) != 0);
      if (bVar3) {
        hVar2.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
        bVar3 = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)this,hVar2,(*rVar4._M_p & rVar4._M_mask) != 0)
        ;
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }